

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void glcts::TextureCubeMapArraySamplingTest::getAttributes
               (samplingFunction sampling_function,attributeDefinition **out_attribute_definitions,
               GLuint *out_n_attributes)

{
  GLuint GVar1;
  
  if (sampling_function < 4) {
    GVar1 = *(GLuint *)(&DAT_016e54b0 + (ulong)sampling_function * 4);
    *out_attribute_definitions =
         (attributeDefinition *)(&PTR_texture_attributes_01dfc838)[sampling_function];
    *out_n_attributes = GVar1;
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getAttributes(samplingFunction			sampling_function,
													const attributeDefinition*& out_attribute_definitions,
													glw::GLuint&				out_n_attributes)
{
	static attributeDefinition texture_attributes[] = { { attribute_texture_coordinate, type_vec4, TextureCoordinates,
														  0 } };

	static attributeDefinition textureLod_attributes[] = {
		{ attribute_texture_coordinate, type_vec4, TextureCoordinates, 0 }, { attribute_lod, type_float, Lod, 1 }
	};

	static attributeDefinition textureGrad_attributes[] = { { attribute_texture_coordinate, type_vec4,
															  TextureCoordinates, 0 },
															{ attribute_grad_x, type_vec3, GradX, 1 },
															{ attribute_grad_y, type_vec3, GradY, 2 } };

	static attributeDefinition textureGather_attributes[] = { { attribute_texture_coordinate, type_vec4,
																TextureCoordinatesForGather, 0 } };

	static const glw::GLuint n_texture_attributes	= sizeof(texture_attributes) / sizeof(texture_attributes[0]);
	static const glw::GLuint n_textureLod_attributes = sizeof(textureLod_attributes) / sizeof(textureLod_attributes[0]);
	static const glw::GLuint n_textureGrad_attributes =
		sizeof(textureGrad_attributes) / sizeof(textureGrad_attributes[0]);
	static const glw::GLuint n_textureGather_attributes =
		sizeof(textureGather_attributes) / sizeof(textureGather_attributes[0]);

	switch (sampling_function)
	{
	case Texture:
		out_attribute_definitions = texture_attributes;
		out_n_attributes		  = n_texture_attributes;
		break;
	case TextureLod:
		out_attribute_definitions = textureLod_attributes;
		out_n_attributes		  = n_textureLod_attributes;
		break;
	case TextureGrad:
		out_attribute_definitions = textureGrad_attributes;
		out_n_attributes		  = n_textureGrad_attributes;
		break;
	case TextureGather:
		out_attribute_definitions = textureGather_attributes;
		out_n_attributes		  = n_textureGather_attributes;
		break;
	};
}